

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
               (tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
                *matchers,tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *values,
               ostream *os)

{
  SolutionHandler *value;
  MatcherInterface<mp::SolutionHandler_&> *pMVar1;
  int iVar2;
  ostream *poVar3;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
            (matchers,values,os);
  Matcher<mp::SolutionHandler_&>::Matcher(&matcher,(Matcher<mp::SolutionHandler_&> *)matchers);
  value = (values->super__Tuple_impl<0UL,_StrictMockProblemBuilder_&,_mp::SolutionHandler_&>).
          super__Tuple_impl<1UL,_mp::SolutionHandler_&>.
          super__Head_base<1UL,_mp::SolutionHandler_&,_false>._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&listener);
  iVar2 = (*((matcher.super_MatcherBase<mp::SolutionHandler_&>.impl_.value_)->
            super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (matcher.super_MatcherBase<mp::SolutionHandler_&>.impl_.value_,value,&listener);
  if ((char)iVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    pMVar1 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<mp::SolutionHandler_&>_>.
             super__Head_base<1UL,_testing::Matcher<mp::SolutionHandler_&>,_false>._M_head_impl.
             super_MatcherBase<mp::SolutionHandler_&>.impl_.value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::operator<<(os,"\n           Actual: ");
    internal2::TypeWithoutFormatter<mp::SolutionHandler,_(testing::internal2::TypeKind)2>::
    PrintValue(value,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<mp::SolutionHandler_&>::~MatcherBase
            (&matcher.super_MatcherBase<mp::SolutionHandler_&>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }